

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  ssize_t sVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 extraout_RAX;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  char status_ch;
  int local_140;
  char local_139;
  string local_138;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_139 = 'L';
  if (reason != TEST_DID_NOT_DIE) {
    local_139 = (reason == TEST_THREW_EXCEPTION) * '\x02' + 'R';
  }
  do {
    sVar1 = write(this->write_fd_,&local_139,1);
    if ((int)sVar1 != -1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _exit(1);
      }
      goto LAB_00159efc;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_118);
  local_f8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_f8 == plVar5) {
    local_e8 = *plVar5;
    lStack_e0 = plVar3[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar5;
  }
  local_f0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8 = (ulong *)*plVar3;
  puVar6 = (ulong *)(plVar3 + 2);
  if (local_d8 == puVar6) {
    local_c8 = *puVar6;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar6;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_140 = 0x1f9;
  StreamableToString<int>(&local_138,&local_140);
  uVar8 = 0xf;
  if (local_d8 != &local_c8) {
    uVar8 = local_c8;
  }
  if (uVar8 < local_138._M_string_length + local_d0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      uVar9 = local_138.field_2._M_allocated_capacity;
    }
    if (local_138._M_string_length + local_d0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_d8);
      goto LAB_00159c35;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_138._M_dataplus._M_p);
LAB_00159c35:
  local_b8 = (long *)*puVar4;
  plVar3 = puVar4 + 2;
  if (local_b8 == plVar3) {
    local_a8 = *plVar3;
    uStack_a0 = puVar4[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
  }
  local_b0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_98 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_98 == plVar5) {
    local_88 = *plVar5;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar5;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_78 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_78 == plVar5) {
    local_68 = *plVar5;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar5;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)*plVar3;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_58._M_dataplus._M_p == psVar7) {
    local_58.field_2._M_allocated_capacity = *psVar7;
    local_58.field_2._8_8_ = plVar3[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar7;
  }
  local_58._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    DeathTestAbort(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_00159efc:
  __stack_chk_fail();
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}